

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh_intersector1.cpp
# Opt level: O3

void embree::avx::
     BVHNIntersector1<8,_1,_false,_embree::avx::ArrayIntersector1<embree::avx::QuadMvIntersector1Moeller<4,_true>_>_>
     ::intersect(Intersectors *This,RayHit *ray,RayQueryContext *context)

{
  undefined4 uVar1;
  undefined4 uVar2;
  anon_union_16_2_47237d3f_for_Vec3fx_0 aVar3;
  Geometry *pGVar4;
  float fVar5;
  float fVar6;
  float fVar7;
  float fVar8;
  float fVar9;
  float fVar10;
  float fVar11;
  float fVar12;
  float fVar13;
  float fVar14;
  float fVar15;
  float fVar16;
  float fVar17;
  float fVar18;
  float fVar19;
  float fVar20;
  float fVar21;
  float fVar22;
  float fVar23;
  float fVar24;
  float fVar25;
  float fVar26;
  float fVar27;
  float fVar28;
  float fVar29;
  float fVar30;
  float fVar31;
  float fVar32;
  float fVar33;
  float fVar34;
  float fVar35;
  float fVar36;
  float fVar37;
  float fVar38;
  float fVar39;
  float fVar40;
  float fVar41;
  float fVar42;
  float fVar43;
  float fVar44;
  float fVar45;
  float fVar46;
  float fVar47;
  float fVar48;
  float fVar49;
  float fVar50;
  float fVar51;
  float fVar52;
  float fVar53;
  float fVar54;
  float fVar55;
  float fVar56;
  float fVar57;
  float fVar58;
  float fVar59;
  float fVar60;
  float fVar61;
  float fVar62;
  float fVar63;
  float fVar64;
  float fVar65;
  float fVar66;
  float fVar67;
  float fVar68;
  undefined1 auVar69 [32];
  undefined1 auVar70 [32];
  undefined1 auVar71 [32];
  undefined1 auVar72 [32];
  undefined1 auVar73 [32];
  undefined4 uVar74;
  undefined1 auVar75 [32];
  float fVar76;
  undefined1 auVar77 [32];
  undefined1 auVar78 [32];
  undefined1 auVar79 [32];
  undefined1 auVar80 [32];
  undefined1 auVar81 [32];
  undefined1 auVar82 [32];
  undefined1 auVar83 [32];
  undefined1 auVar84 [32];
  undefined1 auVar85 [32];
  undefined1 auVar86 [32];
  undefined1 auVar87 [32];
  undefined1 auVar88 [32];
  undefined1 (*pauVar89) [16];
  long lVar90;
  uint uVar91;
  ulong uVar92;
  long lVar93;
  ulong uVar94;
  ulong uVar95;
  undefined1 (*pauVar96) [16];
  uint uVar97;
  Scene *pSVar98;
  undefined1 (*pauVar99) [16];
  ulong uVar100;
  ulong uVar101;
  undefined1 (*pauVar102) [16];
  ulong uVar103;
  undefined1 auVar104 [32];
  undefined1 auVar105 [32];
  undefined1 auVar106 [32];
  undefined1 auVar107 [64];
  undefined1 auVar108 [16];
  undefined1 auVar110 [32];
  undefined1 auVar109 [16];
  undefined1 auVar111 [32];
  undefined1 auVar112 [32];
  undefined1 auVar113 [32];
  undefined1 auVar114 [32];
  undefined1 auVar115 [32];
  float fVar116;
  float fVar120;
  float fVar121;
  undefined1 auVar117 [16];
  float fVar122;
  float fVar123;
  float fVar124;
  float fVar125;
  undefined1 auVar118 [32];
  undefined1 auVar119 [32];
  undefined1 auVar126 [16];
  undefined1 auVar127 [16];
  undefined1 auVar128 [16];
  undefined1 auVar129 [32];
  undefined1 auVar130 [32];
  undefined1 auVar131 [16];
  undefined1 auVar132 [16];
  float fVar133;
  float fVar134;
  undefined1 auVar135 [16];
  undefined1 auVar136 [16];
  undefined1 auVar137 [32];
  undefined1 auVar138 [32];
  undefined1 auVar139 [32];
  undefined1 auVar140 [32];
  undefined1 auVar141 [64];
  undefined1 auVar142 [32];
  undefined1 auVar143 [32];
  undefined1 auVar144 [64];
  float fVar145;
  undefined1 auVar146 [32];
  undefined1 auVar147 [32];
  float fVar149;
  float fVar150;
  float fVar151;
  float fVar152;
  float fVar153;
  float fVar154;
  undefined1 auVar148 [64];
  undefined1 auVar155 [32];
  uint uVar157;
  uint uVar158;
  uint uVar159;
  uint uVar160;
  uint uVar161;
  uint uVar162;
  undefined1 auVar156 [64];
  undefined1 auVar163 [32];
  undefined1 auVar164 [64];
  undefined1 auVar165 [32];
  undefined1 auVar166 [64];
  float fVar167;
  undefined1 auVar168 [32];
  float fVar170;
  float fVar171;
  float fVar172;
  float fVar173;
  float fVar174;
  float fVar175;
  undefined1 auVar169 [64];
  undefined1 auVar176 [32];
  undefined1 auVar177 [32];
  RTCFilterFunctionNArguments args;
  HitK<1> h;
  vbool<8> valid;
  vfloat<8> tNear;
  StackItemT<embree::NodeRefPtr<8>_> stack [564];
  int local_2824;
  long local_2820;
  long local_2818;
  ulong local_2810;
  RayQueryContext *local_2808;
  undefined1 local_2800 [32];
  RTCFilterFunctionNArguments local_27d0;
  undefined1 local_27a0 [32];
  float local_2770;
  float local_276c;
  float local_2768;
  float local_2764;
  float local_2760;
  undefined4 local_275c;
  uint local_2758;
  uint local_2754;
  uint local_2750;
  undefined1 local_2740 [32];
  undefined1 local_2720 [32];
  undefined1 local_2700 [32];
  undefined1 local_26e0 [32];
  undefined1 local_26c0 [32];
  undefined1 local_26a0 [32];
  undefined8 local_2680;
  undefined8 uStack_2678;
  undefined8 uStack_2670;
  undefined8 uStack_2668;
  undefined1 local_2660 [32];
  undefined1 local_2640 [32];
  undefined1 local_2620 [32];
  undefined1 local_2600 [32];
  undefined1 local_25c0 [32];
  float local_25a0 [4];
  float fStack_2590;
  float fStack_258c;
  float fStack_2588;
  undefined4 uStack_2584;
  float local_2580 [4];
  float fStack_2570;
  float fStack_256c;
  float fStack_2568;
  undefined4 uStack_2564;
  undefined1 local_2560 [32];
  float local_2540 [4];
  float fStack_2530;
  float fStack_252c;
  float fStack_2528;
  undefined4 uStack_2524;
  float local_2520 [4];
  float fStack_2510;
  float fStack_250c;
  float fStack_2508;
  undefined4 uStack_2504;
  float local_2500 [4];
  float fStack_24f0;
  float fStack_24ec;
  float fStack_24e8;
  undefined4 uStack_24e4;
  undefined1 local_24e0 [8];
  float fStack_24d8;
  float fStack_24d4;
  float fStack_24d0;
  float fStack_24cc;
  float fStack_24c8;
  undefined1 local_24c0 [32];
  undefined1 local_24a0 [32];
  undefined1 local_2480 [32];
  undefined1 local_2460 [32];
  undefined1 local_2440 [32];
  undefined1 local_2420 [32];
  undefined1 local_2400 [32];
  undefined1 local_23e0 [32];
  undefined8 local_23c0;
  undefined8 uStack_23b8;
  undefined8 uStack_23b0;
  undefined8 uStack_23a8;
  long local_23a0;
  undefined4 uStack_2398;
  undefined1 local_2390 [9056];
  
  local_23a0 = *(long *)&This->ptr[1].bounds.bounds0.lower.field_0;
  if (local_23a0 != 8) {
    local_2808 = context;
    pauVar89 = (undefined1 (*) [16])local_2390;
    uStack_2398 = 0;
    auVar108 = vmaxss_avx(ZEXT816(0) << 0x40,ZEXT416((uint)(ray->super_RayK<1>).org.field_0.m128[3])
                         );
    auVar117 = vmaxss_avx(ZEXT816(0) << 0x40,ZEXT416((uint)(ray->super_RayK<1>).tfar));
    aVar3 = (ray->super_RayK<1>).dir.field_0;
    auVar131._8_4_ = 0x7fffffff;
    auVar131._0_8_ = 0x7fffffff7fffffff;
    auVar131._12_4_ = 0x7fffffff;
    auVar131 = vandps_avx((undefined1  [16])aVar3,auVar131);
    auVar135._8_4_ = 0x219392ef;
    auVar135._0_8_ = 0x219392ef219392ef;
    auVar135._12_4_ = 0x219392ef;
    auVar131 = vcmpps_avx(auVar131,auVar135,1);
    auVar131 = vblendvps_avx((undefined1  [16])aVar3,auVar135,auVar131);
    auVar135 = vrcpps_avx(auVar131);
    fVar116 = auVar135._0_4_;
    auVar126._0_4_ = auVar131._0_4_ * fVar116;
    fVar121 = auVar135._4_4_;
    auVar126._4_4_ = auVar131._4_4_ * fVar121;
    fVar122 = auVar135._8_4_;
    auVar126._8_4_ = auVar131._8_4_ * fVar122;
    fVar123 = auVar135._12_4_;
    auVar126._12_4_ = auVar131._12_4_ * fVar123;
    auVar136._8_4_ = 0x3f800000;
    auVar136._0_8_ = 0x3f8000003f800000;
    auVar136._12_4_ = 0x3f800000;
    auVar131 = vsubps_avx(auVar136,auVar126);
    uVar1 = *(undefined4 *)&(ray->super_RayK<1>).org.field_0;
    local_23e0._4_4_ = uVar1;
    local_23e0._0_4_ = uVar1;
    local_23e0._8_4_ = uVar1;
    local_23e0._12_4_ = uVar1;
    local_23e0._16_4_ = uVar1;
    local_23e0._20_4_ = uVar1;
    local_23e0._24_4_ = uVar1;
    local_23e0._28_4_ = uVar1;
    auVar141 = ZEXT3264(local_23e0);
    uVar1 = *(undefined4 *)((long)&(ray->super_RayK<1>).org.field_0 + 4);
    local_2400._4_4_ = uVar1;
    local_2400._0_4_ = uVar1;
    local_2400._8_4_ = uVar1;
    local_2400._12_4_ = uVar1;
    local_2400._16_4_ = uVar1;
    local_2400._20_4_ = uVar1;
    local_2400._24_4_ = uVar1;
    local_2400._28_4_ = uVar1;
    auVar144 = ZEXT3264(local_2400);
    auVar127._0_4_ = fVar116 + fVar116 * auVar131._0_4_;
    auVar127._4_4_ = fVar121 + fVar121 * auVar131._4_4_;
    auVar127._8_4_ = fVar122 + fVar122 * auVar131._8_4_;
    auVar127._12_4_ = fVar123 + fVar123 * auVar131._12_4_;
    uVar1 = *(undefined4 *)((long)&(ray->super_RayK<1>).org.field_0 + 8);
    local_2420._4_4_ = uVar1;
    local_2420._0_4_ = uVar1;
    local_2420._8_4_ = uVar1;
    local_2420._12_4_ = uVar1;
    local_2420._16_4_ = uVar1;
    local_2420._20_4_ = uVar1;
    local_2420._24_4_ = uVar1;
    local_2420._28_4_ = uVar1;
    auVar148 = ZEXT3264(local_2420);
    auVar131 = vshufps_avx(auVar127,auVar127,0);
    local_2440._16_16_ = auVar131;
    local_2440._0_16_ = auVar131;
    auVar156 = ZEXT3264(local_2440);
    auVar131 = vmovshdup_avx(auVar127);
    auVar135 = vshufps_avx(auVar127,auVar127,0x55);
    local_2460._16_16_ = auVar135;
    local_2460._0_16_ = auVar135;
    auVar164 = ZEXT3264(local_2460);
    auVar135 = vshufpd_avx(auVar127,auVar127,1);
    auVar126 = vshufps_avx(auVar127,auVar127,0xaa);
    local_2810 = (ulong)(auVar127._0_4_ < 0.0) << 5;
    uVar94 = (ulong)(auVar131._0_4_ < 0.0) << 5 | 0x40;
    local_2480._16_16_ = auVar126;
    local_2480._0_16_ = auVar126;
    auVar166 = ZEXT3264(local_2480);
    uVar100 = (ulong)(auVar135._0_4_ < 0.0) << 5 | 0x80;
    uVar101 = local_2810 ^ 0x20;
    auVar131 = vshufps_avx(auVar108,auVar108,0);
    local_24a0._16_16_ = auVar131;
    local_24a0._0_16_ = auVar131;
    auVar169 = ZEXT3264(local_24a0);
    auVar131 = vshufps_avx(auVar117,auVar117,0);
    local_26a0._16_16_ = mm_lookupmask_ps._240_16_;
    local_26a0._0_16_ = mm_lookupmask_ps._240_16_;
    auVar107 = ZEXT3264(CONCAT1616(auVar131,auVar131));
    local_24c0 = vperm2f128_avx(local_26a0,mm_lookupmask_ps._0_32_,2);
    auVar110._8_4_ = 0xbf800000;
    auVar110._0_8_ = 0xbf800000bf800000;
    auVar110._12_4_ = 0xbf800000;
    auVar110._16_4_ = 0xbf800000;
    auVar110._20_4_ = 0xbf800000;
    auVar110._24_4_ = 0xbf800000;
    auVar110._28_4_ = 0xbf800000;
    auVar129._8_4_ = 0x3f800000;
    auVar129._0_8_ = 0x3f8000003f800000;
    auVar129._12_4_ = 0x3f800000;
    auVar129._16_4_ = 0x3f800000;
    auVar129._20_4_ = 0x3f800000;
    auVar129._24_4_ = 0x3f800000;
    auVar129._28_4_ = 0x3f800000;
    _local_24e0 = vblendvps_avx(auVar129,auVar110,local_24c0);
LAB_014d3da2:
    do {
      pauVar102 = pauVar89 + -1;
      pauVar89 = pauVar89 + -1;
      if (*(float *)(*pauVar102 + 8) <= (ray->super_RayK<1>).tfar) {
        uVar95 = *(ulong *)*pauVar89;
        while ((uVar95 & 8) == 0) {
          auVar138 = auVar141._0_32_;
          auVar110 = vsubps_avx(*(undefined1 (*) [32])(uVar95 + 0x40 + local_2810),auVar138);
          auVar146._4_4_ = auVar156._4_4_ * auVar110._4_4_;
          auVar146._0_4_ = auVar156._0_4_ * auVar110._0_4_;
          auVar146._8_4_ = auVar156._8_4_ * auVar110._8_4_;
          auVar146._12_4_ = auVar156._12_4_ * auVar110._12_4_;
          auVar146._16_4_ = auVar156._16_4_ * auVar110._16_4_;
          auVar146._20_4_ = auVar156._20_4_ * auVar110._20_4_;
          auVar146._24_4_ = auVar156._24_4_ * auVar110._24_4_;
          auVar146._28_4_ = auVar110._28_4_;
          auVar142 = auVar144._0_32_;
          auVar110 = vsubps_avx(*(undefined1 (*) [32])(uVar95 + 0x40 + uVar94),auVar142);
          auVar69._4_4_ = auVar164._4_4_ * auVar110._4_4_;
          auVar69._0_4_ = auVar164._0_4_ * auVar110._0_4_;
          auVar69._8_4_ = auVar164._8_4_ * auVar110._8_4_;
          auVar69._12_4_ = auVar164._12_4_ * auVar110._12_4_;
          auVar69._16_4_ = auVar164._16_4_ * auVar110._16_4_;
          auVar69._20_4_ = auVar164._20_4_ * auVar110._20_4_;
          auVar69._24_4_ = auVar164._24_4_ * auVar110._24_4_;
          auVar69._28_4_ = auVar110._28_4_;
          auVar110 = vmaxps_avx(auVar146,auVar69);
          auVar146 = auVar148._0_32_;
          auVar129 = vsubps_avx(*(undefined1 (*) [32])(uVar95 + 0x40 + uVar100),auVar146);
          auVar70._4_4_ = auVar166._4_4_ * auVar129._4_4_;
          auVar70._0_4_ = auVar166._0_4_ * auVar129._0_4_;
          auVar70._8_4_ = auVar166._8_4_ * auVar129._8_4_;
          auVar70._12_4_ = auVar166._12_4_ * auVar129._12_4_;
          auVar70._16_4_ = auVar166._16_4_ * auVar129._16_4_;
          auVar70._20_4_ = auVar166._20_4_ * auVar129._20_4_;
          auVar70._24_4_ = auVar166._24_4_ * auVar129._24_4_;
          auVar70._28_4_ = auVar129._28_4_;
          auVar129 = vmaxps_avx(auVar70,auVar169._0_32_);
          local_2660 = vmaxps_avx(auVar110,auVar129);
          auVar110 = vsubps_avx(*(undefined1 (*) [32])(uVar95 + 0x40 + uVar101),auVar138);
          auVar71._4_4_ = auVar156._4_4_ * auVar110._4_4_;
          auVar71._0_4_ = auVar156._0_4_ * auVar110._0_4_;
          auVar71._8_4_ = auVar156._8_4_ * auVar110._8_4_;
          auVar71._12_4_ = auVar156._12_4_ * auVar110._12_4_;
          auVar71._16_4_ = auVar156._16_4_ * auVar110._16_4_;
          auVar71._20_4_ = auVar156._20_4_ * auVar110._20_4_;
          auVar71._24_4_ = auVar156._24_4_ * auVar110._24_4_;
          auVar71._28_4_ = auVar110._28_4_;
          auVar110 = vsubps_avx(*(undefined1 (*) [32])(uVar95 + 0x40 + (uVar94 ^ 0x20)),auVar142);
          auVar72._4_4_ = auVar164._4_4_ * auVar110._4_4_;
          auVar72._0_4_ = auVar164._0_4_ * auVar110._0_4_;
          auVar72._8_4_ = auVar164._8_4_ * auVar110._8_4_;
          auVar72._12_4_ = auVar164._12_4_ * auVar110._12_4_;
          auVar72._16_4_ = auVar164._16_4_ * auVar110._16_4_;
          auVar72._20_4_ = auVar164._20_4_ * auVar110._20_4_;
          auVar72._24_4_ = auVar164._24_4_ * auVar110._24_4_;
          auVar72._28_4_ = auVar110._28_4_;
          auVar110 = vminps_avx(auVar71,auVar72);
          auVar129 = vsubps_avx(*(undefined1 (*) [32])(uVar95 + 0x40 + (uVar100 ^ 0x20)),auVar146);
          auVar73._4_4_ = auVar166._4_4_ * auVar129._4_4_;
          auVar73._0_4_ = auVar166._0_4_ * auVar129._0_4_;
          auVar73._8_4_ = auVar166._8_4_ * auVar129._8_4_;
          auVar73._12_4_ = auVar166._12_4_ * auVar129._12_4_;
          auVar73._16_4_ = auVar166._16_4_ * auVar129._16_4_;
          auVar73._20_4_ = auVar166._20_4_ * auVar129._20_4_;
          auVar73._24_4_ = auVar166._24_4_ * auVar129._24_4_;
          auVar73._28_4_ = auVar129._28_4_;
          auVar129 = vminps_avx(auVar73,auVar107._0_32_);
          auVar110 = vminps_avx(auVar110,auVar129);
          auVar110 = vcmpps_avx(local_2660,auVar110,2);
          uVar97 = vmovmskps_avx(auVar110);
          if (uVar97 == 0) {
            if (pauVar89 == (undefined1 (*) [16])&local_23a0) {
              return;
            }
            goto LAB_014d3da2;
          }
          uVar97 = uVar97 & 0xff;
          uVar92 = uVar95 & 0xfffffffffffffff0;
          lVar93 = 0;
          if (uVar97 != 0) {
            for (; (uVar97 >> lVar93 & 1) == 0; lVar93 = lVar93 + 1) {
            }
          }
          uVar95 = *(ulong *)(uVar92 + lVar93 * 8);
          uVar97 = uVar97 - 1 & uVar97;
          if (uVar97 != 0) {
            uVar157 = *(uint *)(local_2660 + lVar93 * 4);
            lVar93 = 0;
            if (uVar97 != 0) {
              for (; (uVar97 >> lVar93 & 1) == 0; lVar93 = lVar93 + 1) {
              }
            }
            uVar103 = *(ulong *)(uVar92 + lVar93 * 8);
            uVar91 = *(uint *)(local_2660 + lVar93 * 4);
            uVar97 = uVar97 - 1 & uVar97;
            if (uVar97 == 0) {
              if (uVar157 < uVar91) {
                *(ulong *)*pauVar89 = uVar103;
                *(uint *)(*pauVar89 + 8) = uVar91;
                pauVar89 = pauVar89 + 1;
              }
              else {
                *(ulong *)*pauVar89 = uVar95;
                *(uint *)(*pauVar89 + 8) = uVar157;
                pauVar89 = pauVar89 + 1;
                uVar95 = uVar103;
              }
            }
            else {
              auVar108._8_8_ = 0;
              auVar108._0_8_ = uVar95;
              auVar131 = vpunpcklqdq_avx(auVar108,ZEXT416(uVar157));
              auVar117._8_8_ = 0;
              auVar117._0_8_ = uVar103;
              auVar108 = vpunpcklqdq_avx(auVar117,ZEXT416(uVar91));
              lVar93 = 0;
              if (uVar97 != 0) {
                for (; (uVar97 >> lVar93 & 1) == 0; lVar93 = lVar93 + 1) {
                }
              }
              auVar128._8_8_ = 0;
              auVar128._0_8_ = *(ulong *)(uVar92 + lVar93 * 8);
              auVar117 = vpunpcklqdq_avx(auVar128,ZEXT416(*(uint *)(local_2660 + lVar93 * 4)));
              uVar97 = uVar97 - 1 & uVar97;
              if (uVar97 == 0) {
                auVar135 = vpcmpgtd_avx(auVar108,auVar131);
                auVar126 = vpshufd_avx(auVar135,0xaa);
                auVar135 = vblendvps_avx(auVar108,auVar131,auVar126);
                auVar131 = vblendvps_avx(auVar131,auVar108,auVar126);
                auVar108 = vpcmpgtd_avx(auVar117,auVar135);
                auVar126 = vpshufd_avx(auVar108,0xaa);
                auVar108 = vblendvps_avx(auVar117,auVar135,auVar126);
                auVar117 = vblendvps_avx(auVar135,auVar117,auVar126);
                auVar135 = vpcmpgtd_avx(auVar117,auVar131);
                auVar126 = vpshufd_avx(auVar135,0xaa);
                auVar135 = vblendvps_avx(auVar117,auVar131,auVar126);
                auVar131 = vblendvps_avx(auVar131,auVar117,auVar126);
                *pauVar89 = auVar131;
                pauVar89[1] = auVar135;
                uVar95 = auVar108._0_8_;
                pauVar89 = pauVar89 + 2;
              }
              else {
                lVar93 = 0;
                if (uVar97 != 0) {
                  for (; (uVar97 >> lVar93 & 1) == 0; lVar93 = lVar93 + 1) {
                  }
                }
                auVar132._8_8_ = 0;
                auVar132._0_8_ = *(ulong *)(uVar92 + lVar93 * 8);
                auVar135 = vpunpcklqdq_avx(auVar132,ZEXT416(*(uint *)(local_2660 + lVar93 * 4)));
                uVar97 = uVar97 - 1 & uVar97;
                uVar103 = (ulong)uVar97;
                if (uVar97 == 0) {
                  auVar126 = vpcmpgtd_avx(auVar108,auVar131);
                  auVar127 = vpshufd_avx(auVar126,0xaa);
                  auVar126 = vblendvps_avx(auVar108,auVar131,auVar127);
                  auVar131 = vblendvps_avx(auVar131,auVar108,auVar127);
                  auVar108 = vpcmpgtd_avx(auVar135,auVar117);
                  auVar127 = vpshufd_avx(auVar108,0xaa);
                  auVar108 = vblendvps_avx(auVar135,auVar117,auVar127);
                  auVar117 = vblendvps_avx(auVar117,auVar135,auVar127);
                  auVar135 = vpcmpgtd_avx(auVar117,auVar131);
                  auVar127 = vpshufd_avx(auVar135,0xaa);
                  auVar135 = vblendvps_avx(auVar117,auVar131,auVar127);
                  auVar131 = vblendvps_avx(auVar131,auVar117,auVar127);
                  auVar117 = vpcmpgtd_avx(auVar108,auVar126);
                  auVar127 = vpshufd_avx(auVar117,0xaa);
                  auVar117 = vblendvps_avx(auVar108,auVar126,auVar127);
                  auVar108 = vblendvps_avx(auVar126,auVar108,auVar127);
                  auVar126 = vpcmpgtd_avx(auVar135,auVar108);
                  auVar127 = vpshufd_avx(auVar126,0xaa);
                  auVar126 = vblendvps_avx(auVar135,auVar108,auVar127);
                  auVar108 = vblendvps_avx(auVar108,auVar135,auVar127);
                  *pauVar89 = auVar131;
                  pauVar89[1] = auVar108;
                  pauVar89[2] = auVar126;
                  uVar95 = auVar117._0_8_;
                  pauVar102 = pauVar89 + 3;
                }
                else {
                  *pauVar89 = auVar131;
                  pauVar89[1] = auVar108;
                  pauVar89[2] = auVar117;
                  pauVar89[3] = auVar135;
                  lVar93 = 0x30;
                  do {
                    lVar90 = lVar93;
                    lVar93 = 0;
                    if (uVar103 != 0) {
                      for (; (uVar103 >> lVar93 & 1) == 0; lVar93 = lVar93 + 1) {
                      }
                    }
                    uVar95 = *(ulong *)(uVar92 + lVar93 * 8);
                    auVar109._8_8_ = 0;
                    auVar109._0_8_ = uVar95;
                    auVar131 = vpunpcklqdq_avx(auVar109,ZEXT416(*(uint *)(local_2660 + lVar93 * 4)))
                    ;
                    *(undefined1 (*) [16])(pauVar89[1] + lVar90) = auVar131;
                    uVar103 = uVar103 & uVar103 - 1;
                    lVar93 = lVar90 + 0x10;
                  } while (uVar103 != 0);
                  pauVar102 = (undefined1 (*) [16])(pauVar89[1] + lVar90);
                  if (lVar90 + 0x10 != 0) {
                    lVar93 = 0x10;
                    pauVar99 = pauVar89;
                    do {
                      auVar131 = pauVar99[1];
                      pauVar99 = pauVar99 + 1;
                      uVar97 = vextractps_avx(auVar131,2);
                      lVar90 = lVar93;
                      do {
                        if (uVar97 <= *(uint *)(pauVar89[-1] + lVar90 + 8)) {
                          pauVar96 = (undefined1 (*) [16])(*pauVar89 + lVar90);
                          break;
                        }
                        *(undefined1 (*) [16])(*pauVar89 + lVar90) =
                             *(undefined1 (*) [16])(pauVar89[-1] + lVar90);
                        lVar90 = lVar90 + -0x10;
                        pauVar96 = pauVar89;
                      } while (lVar90 != 0);
                      *pauVar96 = auVar131;
                      lVar93 = lVar93 + 0x10;
                    } while (pauVar102 != pauVar99);
                    uVar95 = *(ulong *)*pauVar102;
                  }
                }
                auVar141 = ZEXT3264(auVar138);
                auVar144 = ZEXT3264(auVar142);
                auVar148 = ZEXT3264(auVar146);
                auVar156 = ZEXT3264(auVar156._0_32_);
                auVar164 = ZEXT3264(auVar164._0_32_);
                auVar166 = ZEXT3264(auVar166._0_32_);
                auVar169 = ZEXT3264(auVar169._0_32_);
                pauVar89 = pauVar102;
              }
            }
          }
        }
        local_2818 = (ulong)((uint)uVar95 & 0xf) - 8;
        if (local_2818 != 0) {
          uVar95 = uVar95 & 0xfffffffffffffff0;
          local_2820 = 0;
          do {
            lVar90 = local_2820 * 0xe0;
            lVar93 = uVar95 + 0xd0 + lVar90;
            local_2680 = *(undefined8 *)(lVar93 + 0x10);
            uStack_2678 = *(undefined8 *)(lVar93 + 0x18);
            lVar93 = uVar95 + 0xc0 + lVar90;
            local_23c0 = *(undefined8 *)(lVar93 + 0x10);
            uStack_23b8 = *(undefined8 *)(lVar93 + 0x18);
            uStack_23b0 = local_23c0;
            uStack_23a8 = uStack_23b8;
            uStack_2670 = local_2680;
            uStack_2668 = uStack_2678;
            auVar130._16_16_ = *(undefined1 (*) [16])(uVar95 + 0x60 + lVar90);
            auVar130._0_16_ = *(undefined1 (*) [16])(uVar95 + lVar90);
            auVar137._16_16_ = *(undefined1 (*) [16])(uVar95 + 0x70 + lVar90);
            auVar137._0_16_ = *(undefined1 (*) [16])(uVar95 + 0x10 + lVar90);
            auVar143._16_16_ = *(undefined1 (*) [16])(uVar95 + 0x80 + lVar90);
            auVar143._0_16_ = *(undefined1 (*) [16])(uVar95 + 0x20 + lVar90);
            auVar131 = *(undefined1 (*) [16])(uVar95 + 0x30 + lVar90);
            auVar104._16_16_ = auVar131;
            auVar104._0_16_ = auVar131;
            auVar108 = *(undefined1 (*) [16])(uVar95 + 0x40 + lVar90);
            auVar111._16_16_ = auVar108;
            auVar111._0_16_ = auVar108;
            auVar117 = *(undefined1 (*) [16])(uVar95 + 0x50 + lVar90);
            auVar118._16_16_ = auVar117;
            auVar118._0_16_ = auVar117;
            auVar135 = *(undefined1 (*) [16])(uVar95 + 0x90 + lVar90);
            auVar155._16_16_ = auVar135;
            auVar155._0_16_ = auVar135;
            auVar135 = *(undefined1 (*) [16])(uVar95 + 0xa0 + lVar90);
            auVar163._16_16_ = auVar135;
            auVar163._0_16_ = auVar135;
            auVar135 = *(undefined1 (*) [16])(uVar95 + 0xb0 + lVar90);
            auVar165._16_16_ = auVar135;
            auVar165._0_16_ = auVar135;
            local_27a0 = vsubps_avx(auVar130,auVar104);
            local_2800 = vsubps_avx(auVar137,auVar111);
            auVar110 = vsubps_avx(auVar143,auVar118);
            auVar129 = vsubps_avx(auVar155,auVar130);
            auVar146 = vsubps_avx(auVar163,auVar137);
            auVar69 = vsubps_avx(auVar165,auVar143);
            fVar123 = auVar69._0_4_;
            fVar167 = local_2800._0_4_;
            fVar9 = auVar69._4_4_;
            fVar170 = local_2800._4_4_;
            auVar138._4_4_ = fVar170 * fVar9;
            auVar138._0_4_ = fVar167 * fVar123;
            fVar19 = auVar69._8_4_;
            fVar171 = local_2800._8_4_;
            auVar138._8_4_ = fVar171 * fVar19;
            fVar29 = auVar69._12_4_;
            fVar172 = local_2800._12_4_;
            auVar138._12_4_ = fVar172 * fVar29;
            fVar39 = auVar69._16_4_;
            fVar173 = local_2800._16_4_;
            auVar138._16_4_ = fVar173 * fVar39;
            fVar49 = auVar69._20_4_;
            fVar174 = local_2800._20_4_;
            auVar138._20_4_ = fVar174 * fVar49;
            fVar59 = auVar69._24_4_;
            fVar175 = local_2800._24_4_;
            auVar138._24_4_ = fVar175 * fVar59;
            auVar138._28_4_ = auVar131._12_4_;
            fVar124 = auVar146._0_4_;
            fVar145 = auVar110._0_4_;
            fVar10 = auVar146._4_4_;
            fVar149 = auVar110._4_4_;
            auVar142._4_4_ = fVar149 * fVar10;
            auVar142._0_4_ = fVar145 * fVar124;
            fVar20 = auVar146._8_4_;
            fVar150 = auVar110._8_4_;
            auVar142._8_4_ = fVar150 * fVar20;
            fVar30 = auVar146._12_4_;
            fVar151 = auVar110._12_4_;
            auVar142._12_4_ = fVar151 * fVar30;
            fVar40 = auVar146._16_4_;
            fVar152 = auVar110._16_4_;
            auVar142._16_4_ = fVar152 * fVar40;
            fVar50 = auVar146._20_4_;
            fVar153 = auVar110._20_4_;
            auVar142._20_4_ = fVar153 * fVar50;
            fVar60 = auVar146._24_4_;
            uVar74 = auVar108._12_4_;
            fVar154 = auVar110._24_4_;
            auVar142._24_4_ = fVar154 * fVar60;
            auVar142._28_4_ = uVar74;
            local_2700 = vsubps_avx(auVar142,auVar138);
            fVar125 = auVar129._0_4_;
            fVar11 = auVar129._4_4_;
            auVar75._4_4_ = fVar149 * fVar11;
            auVar75._0_4_ = fVar145 * fVar125;
            fVar21 = auVar129._8_4_;
            auVar75._8_4_ = fVar150 * fVar21;
            fVar31 = auVar129._12_4_;
            auVar75._12_4_ = fVar151 * fVar31;
            fVar41 = auVar129._16_4_;
            auVar75._16_4_ = fVar152 * fVar41;
            fVar51 = auVar129._20_4_;
            auVar75._20_4_ = fVar153 * fVar51;
            fVar61 = auVar129._24_4_;
            auVar75._24_4_ = fVar154 * fVar61;
            auVar75._28_4_ = uVar74;
            fVar133 = local_27a0._0_4_;
            fVar12 = local_27a0._4_4_;
            auVar77._4_4_ = fVar9 * fVar12;
            auVar77._0_4_ = fVar123 * fVar133;
            fVar22 = local_27a0._8_4_;
            auVar77._8_4_ = fVar19 * fVar22;
            fVar32 = local_27a0._12_4_;
            auVar77._12_4_ = fVar29 * fVar32;
            fVar42 = local_27a0._16_4_;
            auVar77._16_4_ = fVar39 * fVar42;
            fVar52 = local_27a0._20_4_;
            auVar77._20_4_ = fVar49 * fVar52;
            fVar62 = local_27a0._24_4_;
            fVar76 = auVar117._12_4_;
            auVar77._24_4_ = fVar59 * fVar62;
            auVar77._28_4_ = fVar76;
            auVar110 = vsubps_avx(auVar77,auVar75);
            auVar78._4_4_ = fVar10 * fVar12;
            auVar78._0_4_ = fVar124 * fVar133;
            auVar78._8_4_ = fVar20 * fVar22;
            auVar78._12_4_ = fVar30 * fVar32;
            auVar78._16_4_ = fVar40 * fVar42;
            auVar78._20_4_ = fVar50 * fVar52;
            auVar78._24_4_ = fVar60 * fVar62;
            auVar78._28_4_ = fVar76;
            auVar79._4_4_ = fVar170 * fVar11;
            auVar79._0_4_ = fVar167 * fVar125;
            auVar79._8_4_ = fVar171 * fVar21;
            auVar79._12_4_ = fVar172 * fVar31;
            auVar79._16_4_ = fVar173 * fVar41;
            auVar79._20_4_ = fVar174 * fVar51;
            auVar79._24_4_ = fVar175 * fVar61;
            auVar79._28_4_ = local_2800._28_4_;
            local_2740 = vsubps_avx(auVar79,auVar78);
            uVar1 = *(undefined4 *)&(ray->super_RayK<1>).org.field_0;
            auVar168._4_4_ = uVar1;
            auVar168._0_4_ = uVar1;
            auVar168._8_4_ = uVar1;
            auVar168._12_4_ = uVar1;
            auVar168._16_4_ = uVar1;
            auVar168._20_4_ = uVar1;
            auVar168._24_4_ = uVar1;
            auVar168._28_4_ = uVar1;
            uVar1 = *(undefined4 *)((long)&(ray->super_RayK<1>).org.field_0 + 4);
            auVar176._4_4_ = uVar1;
            auVar176._0_4_ = uVar1;
            auVar176._8_4_ = uVar1;
            auVar176._12_4_ = uVar1;
            auVar176._16_4_ = uVar1;
            auVar176._20_4_ = uVar1;
            auVar176._24_4_ = uVar1;
            auVar176._28_4_ = uVar1;
            uVar2 = *(undefined4 *)((long)&(ray->super_RayK<1>).org.field_0 + 8);
            auVar177._4_4_ = uVar2;
            auVar177._0_4_ = uVar2;
            auVar177._8_4_ = uVar2;
            auVar177._12_4_ = uVar2;
            auVar177._16_4_ = uVar2;
            auVar177._20_4_ = uVar2;
            auVar177._24_4_ = uVar2;
            auVar177._28_4_ = uVar2;
            fVar116 = (ray->super_RayK<1>).dir.field_0.m128[1];
            auVar70 = vsubps_avx(auVar130,auVar168);
            fVar121 = (ray->super_RayK<1>).dir.field_0.m128[2];
            auVar71 = vsubps_avx(auVar137,auVar176);
            auVar72 = vsubps_avx(auVar143,auVar177);
            fVar134 = auVar72._0_4_;
            fVar13 = auVar72._4_4_;
            auVar80._4_4_ = fVar116 * fVar13;
            auVar80._0_4_ = fVar116 * fVar134;
            fVar23 = auVar72._8_4_;
            auVar80._8_4_ = fVar116 * fVar23;
            fVar33 = auVar72._12_4_;
            auVar80._12_4_ = fVar116 * fVar33;
            fVar43 = auVar72._16_4_;
            auVar80._16_4_ = fVar116 * fVar43;
            fVar53 = auVar72._20_4_;
            auVar80._20_4_ = fVar116 * fVar53;
            fVar63 = auVar72._24_4_;
            auVar80._24_4_ = fVar116 * fVar63;
            auVar80._28_4_ = uVar1;
            fVar120 = auVar71._0_4_;
            fVar14 = auVar71._4_4_;
            auVar81._4_4_ = fVar121 * fVar14;
            auVar81._0_4_ = fVar121 * fVar120;
            fVar24 = auVar71._8_4_;
            auVar81._8_4_ = fVar121 * fVar24;
            fVar34 = auVar71._12_4_;
            auVar81._12_4_ = fVar121 * fVar34;
            fVar44 = auVar71._16_4_;
            auVar81._16_4_ = fVar121 * fVar44;
            fVar54 = auVar71._20_4_;
            auVar81._20_4_ = fVar121 * fVar54;
            fVar64 = auVar71._24_4_;
            auVar81._24_4_ = fVar121 * fVar64;
            auVar81._28_4_ = uVar2;
            auVar71 = vsubps_avx(auVar81,auVar80);
            fVar122 = (ray->super_RayK<1>).dir.field_0.m128[0];
            fVar5 = auVar70._0_4_;
            fVar15 = auVar70._4_4_;
            auVar82._4_4_ = fVar121 * fVar15;
            auVar82._0_4_ = fVar121 * fVar5;
            fVar25 = auVar70._8_4_;
            auVar82._8_4_ = fVar121 * fVar25;
            fVar35 = auVar70._12_4_;
            auVar82._12_4_ = fVar121 * fVar35;
            fVar45 = auVar70._16_4_;
            auVar82._16_4_ = fVar121 * fVar45;
            fVar55 = auVar70._20_4_;
            auVar82._20_4_ = fVar121 * fVar55;
            fVar65 = auVar70._24_4_;
            auVar82._24_4_ = fVar121 * fVar65;
            auVar82._28_4_ = local_2700._28_4_;
            auVar83._4_4_ = fVar122 * fVar13;
            auVar83._0_4_ = fVar122 * fVar134;
            auVar83._8_4_ = fVar122 * fVar23;
            auVar83._12_4_ = fVar122 * fVar33;
            auVar83._16_4_ = fVar122 * fVar43;
            auVar83._20_4_ = fVar122 * fVar53;
            auVar83._24_4_ = fVar122 * fVar63;
            auVar83._28_4_ = uVar74;
            auVar70 = vsubps_avx(auVar83,auVar82);
            auVar84._4_4_ = fVar122 * fVar14;
            auVar84._0_4_ = fVar122 * fVar120;
            auVar84._8_4_ = fVar122 * fVar24;
            auVar84._12_4_ = fVar122 * fVar34;
            auVar84._16_4_ = fVar122 * fVar44;
            auVar84._20_4_ = fVar122 * fVar54;
            auVar84._24_4_ = fVar122 * fVar64;
            auVar84._28_4_ = uVar74;
            auVar85._4_4_ = fVar116 * fVar15;
            auVar85._0_4_ = fVar116 * fVar5;
            auVar85._8_4_ = fVar116 * fVar25;
            auVar85._12_4_ = fVar116 * fVar35;
            auVar85._16_4_ = fVar116 * fVar45;
            auVar85._20_4_ = fVar116 * fVar55;
            auVar85._24_4_ = fVar116 * fVar65;
            auVar85._28_4_ = fVar76;
            auVar72 = vsubps_avx(auVar85,auVar84);
            fVar6 = local_2740._0_4_;
            fVar16 = local_2740._4_4_;
            fVar26 = local_2740._8_4_;
            fVar36 = local_2740._12_4_;
            fVar46 = local_2740._16_4_;
            fVar56 = local_2740._20_4_;
            fVar66 = local_2740._24_4_;
            fVar7 = auVar110._0_4_;
            fVar17 = auVar110._4_4_;
            fVar27 = auVar110._8_4_;
            fVar37 = auVar110._12_4_;
            fVar47 = auVar110._16_4_;
            fVar57 = auVar110._20_4_;
            fVar67 = auVar110._24_4_;
            fVar8 = local_2700._0_4_;
            fVar18 = local_2700._4_4_;
            fVar28 = local_2700._8_4_;
            fVar38 = local_2700._12_4_;
            fVar48 = local_2700._16_4_;
            fVar58 = local_2700._20_4_;
            fVar68 = local_2700._24_4_;
            auVar119._0_4_ = fVar122 * fVar8 + fVar116 * fVar7 + fVar121 * fVar6;
            auVar119._4_4_ = fVar122 * fVar18 + fVar116 * fVar17 + fVar121 * fVar16;
            auVar119._8_4_ = fVar122 * fVar28 + fVar116 * fVar27 + fVar121 * fVar26;
            auVar119._12_4_ = fVar122 * fVar38 + fVar116 * fVar37 + fVar121 * fVar36;
            auVar119._16_4_ = fVar122 * fVar48 + fVar116 * fVar47 + fVar121 * fVar46;
            auVar119._20_4_ = fVar122 * fVar58 + fVar116 * fVar57 + fVar121 * fVar56;
            auVar119._24_4_ = fVar122 * fVar68 + fVar116 * fVar67 + fVar121 * fVar66;
            auVar119._28_4_ = fVar121 + fVar121 + fVar76;
            auVar112._8_4_ = 0x80000000;
            auVar112._0_8_ = 0x8000000080000000;
            auVar112._12_4_ = 0x80000000;
            auVar112._16_4_ = 0x80000000;
            auVar112._20_4_ = 0x80000000;
            auVar112._24_4_ = 0x80000000;
            auVar112._28_4_ = 0x80000000;
            auVar110 = vandps_avx(auVar119,auVar112);
            uVar97 = auVar110._0_4_;
            auVar139._0_4_ =
                 (float)(uVar97 ^ (uint)(fVar125 * auVar71._0_4_ +
                                        fVar124 * auVar70._0_4_ + fVar123 * auVar72._0_4_));
            uVar157 = auVar110._4_4_;
            auVar139._4_4_ =
                 (float)(uVar157 ^
                        (uint)(fVar11 * auVar71._4_4_ +
                              fVar10 * auVar70._4_4_ + fVar9 * auVar72._4_4_));
            uVar91 = auVar110._8_4_;
            auVar139._8_4_ =
                 (float)(uVar91 ^ (uint)(fVar21 * auVar71._8_4_ +
                                        fVar20 * auVar70._8_4_ + fVar19 * auVar72._8_4_));
            uVar158 = auVar110._12_4_;
            auVar139._12_4_ =
                 (float)(uVar158 ^
                        (uint)(fVar31 * auVar71._12_4_ +
                              fVar30 * auVar70._12_4_ + fVar29 * auVar72._12_4_));
            uVar159 = auVar110._16_4_;
            auVar139._16_4_ =
                 (float)(uVar159 ^
                        (uint)(fVar41 * auVar71._16_4_ +
                              fVar40 * auVar70._16_4_ + fVar39 * auVar72._16_4_));
            uVar160 = auVar110._20_4_;
            auVar139._20_4_ =
                 (float)(uVar160 ^
                        (uint)(fVar51 * auVar71._20_4_ +
                              fVar50 * auVar70._20_4_ + fVar49 * auVar72._20_4_));
            uVar161 = auVar110._24_4_;
            auVar139._24_4_ =
                 (float)(uVar161 ^
                        (uint)(fVar61 * auVar71._24_4_ +
                              fVar60 * auVar70._24_4_ + fVar59 * auVar72._24_4_));
            uVar162 = auVar110._28_4_;
            auVar139._28_4_ =
                 (float)(uVar162 ^ (uint)(auVar129._28_4_ + auVar146._28_4_ + auVar69._28_4_));
            auVar147._0_4_ =
                 (float)(uVar97 ^ (uint)(auVar71._0_4_ * fVar133 +
                                        auVar70._0_4_ * fVar167 + fVar145 * auVar72._0_4_));
            auVar147._4_4_ =
                 (float)(uVar157 ^
                        (uint)(auVar71._4_4_ * fVar12 +
                              auVar70._4_4_ * fVar170 + fVar149 * auVar72._4_4_));
            auVar147._8_4_ =
                 (float)(uVar91 ^ (uint)(auVar71._8_4_ * fVar22 +
                                        auVar70._8_4_ * fVar171 + fVar150 * auVar72._8_4_));
            auVar147._12_4_ =
                 (float)(uVar158 ^
                        (uint)(auVar71._12_4_ * fVar32 +
                              auVar70._12_4_ * fVar172 + fVar151 * auVar72._12_4_));
            auVar147._16_4_ =
                 (float)(uVar159 ^
                        (uint)(auVar71._16_4_ * fVar42 +
                              auVar70._16_4_ * fVar173 + fVar152 * auVar72._16_4_));
            auVar147._20_4_ =
                 (float)(uVar160 ^
                        (uint)(auVar71._20_4_ * fVar52 +
                              auVar70._20_4_ * fVar174 + fVar153 * auVar72._20_4_));
            auVar147._24_4_ =
                 (float)(uVar161 ^
                        (uint)(auVar71._24_4_ * fVar62 +
                              auVar70._24_4_ * fVar175 + fVar154 * auVar72._24_4_));
            auVar147._28_4_ = (float)(uVar162 ^ (uint)(auVar70._28_4_ + auVar72._28_4_ + -0.0));
            auVar129 = ZEXT1232(ZEXT412(0)) << 0x20;
            auVar110 = vcmpps_avx(auVar139,auVar129,5);
            auVar129 = vcmpps_avx(auVar147,auVar129,5);
            auVar110 = vandps_avx(auVar110,auVar129);
            auVar113._8_4_ = 0x7fffffff;
            auVar113._0_8_ = 0x7fffffff7fffffff;
            auVar113._12_4_ = 0x7fffffff;
            auVar113._16_4_ = 0x7fffffff;
            auVar113._20_4_ = 0x7fffffff;
            auVar113._24_4_ = 0x7fffffff;
            auVar113._28_4_ = 0x7fffffff;
            local_2600 = vandps_avx(auVar119,auVar113);
            auVar129 = vcmpps_avx(ZEXT1232(ZEXT412(0)) << 0x20,auVar119,4);
            auVar110 = vandps_avx(auVar110,auVar129);
            auVar114._0_4_ = auVar147._0_4_ + auVar139._0_4_;
            auVar114._4_4_ = auVar147._4_4_ + auVar139._4_4_;
            auVar114._8_4_ = auVar147._8_4_ + auVar139._8_4_;
            auVar114._12_4_ = auVar147._12_4_ + auVar139._12_4_;
            auVar114._16_4_ = auVar147._16_4_ + auVar139._16_4_;
            auVar114._20_4_ = auVar147._20_4_ + auVar139._20_4_;
            auVar114._24_4_ = auVar147._24_4_ + auVar139._24_4_;
            auVar114._28_4_ = auVar147._28_4_ + auVar139._28_4_;
            auVar146 = vcmpps_avx(auVar114,local_2600,2);
            auVar129 = vandps_avx(auVar110,auVar146);
            auVar69 = local_26a0 & auVar129;
            if ((((((((auVar69 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                     (auVar69 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                    (auVar69 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                   SUB321(auVar69 >> 0x7f,0) != '\0') ||
                  (auVar69 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                 SUB321(auVar69 >> 0xbf,0) != '\0') ||
                (auVar69 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                auVar69[0x1f] < '\0') {
              auVar129 = vandps_avx(auVar129,local_26a0);
              local_2620._0_4_ =
                   (float)(uVar97 ^ (uint)(fVar8 * fVar5 + fVar7 * fVar120 + fVar134 * fVar6));
              local_2620._4_4_ =
                   (float)(uVar157 ^ (uint)(fVar18 * fVar15 + fVar17 * fVar14 + fVar13 * fVar16));
              local_2620._8_4_ =
                   (float)(uVar91 ^ (uint)(fVar28 * fVar25 + fVar27 * fVar24 + fVar23 * fVar26));
              local_2620._12_4_ =
                   (float)(uVar158 ^ (uint)(fVar38 * fVar35 + fVar37 * fVar34 + fVar33 * fVar36));
              local_2620._16_4_ =
                   (float)(uVar159 ^ (uint)(fVar48 * fVar45 + fVar47 * fVar44 + fVar43 * fVar46));
              local_2620._20_4_ =
                   (float)(uVar160 ^ (uint)(fVar58 * fVar55 + fVar57 * fVar54 + fVar53 * fVar56));
              local_2620._24_4_ =
                   (float)(uVar161 ^ (uint)(fVar68 * fVar65 + fVar67 * fVar64 + fVar63 * fVar66));
              local_2620._28_4_ =
                   uVar162 ^ (uint)(auVar146._28_4_ + auVar146._28_4_ + auVar110._28_4_);
              fVar116 = (ray->super_RayK<1>).org.field_0.m128[3];
              fVar121 = local_2600._0_4_;
              fVar122 = local_2600._4_4_;
              auVar86._4_4_ = fVar122 * fVar116;
              auVar86._0_4_ = fVar121 * fVar116;
              fVar123 = local_2600._8_4_;
              auVar86._8_4_ = fVar123 * fVar116;
              fVar124 = local_2600._12_4_;
              auVar86._12_4_ = fVar124 * fVar116;
              fVar125 = local_2600._16_4_;
              auVar86._16_4_ = fVar125 * fVar116;
              fVar133 = local_2600._20_4_;
              auVar86._20_4_ = fVar133 * fVar116;
              fVar134 = local_2600._24_4_;
              auVar86._24_4_ = fVar134 * fVar116;
              auVar86._28_4_ = fVar116;
              auVar110 = vcmpps_avx(auVar86,local_2620,1);
              fVar116 = (ray->super_RayK<1>).tfar;
              auVar87._4_4_ = fVar122 * fVar116;
              auVar87._0_4_ = fVar121 * fVar116;
              auVar87._8_4_ = fVar123 * fVar116;
              auVar87._12_4_ = fVar124 * fVar116;
              auVar87._16_4_ = fVar125 * fVar116;
              auVar87._20_4_ = fVar133 * fVar116;
              auVar87._24_4_ = fVar134 * fVar116;
              auVar87._28_4_ = fVar116;
              auVar146 = vcmpps_avx(local_2620,auVar87,2);
              auVar110 = vandps_avx(auVar146,auVar110);
              auVar146 = auVar129 & auVar110;
              if ((((((((auVar146 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                       (auVar146 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                      (auVar146 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                     SUB321(auVar146 >> 0x7f,0) != '\0') ||
                    (auVar146 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                   SUB321(auVar146 >> 0xbf,0) != '\0') ||
                  (auVar146 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                  auVar146[0x1f] < '\0') {
                auVar146 = *(undefined1 (*) [32])&(ray->super_RayK<1>).tfar;
                auVar144 = ZEXT3264(auVar146);
                auVar110 = vandps_avx(auVar129,auVar110);
                local_25c0 = auVar110;
                auVar129 = vsubps_avx(local_2600,auVar147);
                local_2660 = vblendvps_avx(auVar139,auVar129,local_24c0);
                auVar129 = vsubps_avx(local_2600,auVar139);
                local_2640 = vblendvps_avx(auVar147,auVar129,local_24c0);
                uStack_2524 = local_24c0._28_4_;
                local_2540[0] = fVar8 * (float)local_24e0._0_4_;
                local_2540[1] = fVar18 * (float)local_24e0._4_4_;
                local_2540[2] = fVar28 * fStack_24d8;
                local_2540[3] = fVar38 * fStack_24d4;
                fStack_2530 = fVar48 * fStack_24d0;
                fStack_252c = fVar58 * fStack_24cc;
                fStack_2528 = fVar68 * fStack_24c8;
                local_2520[0] = fVar7 * (float)local_24e0._0_4_;
                local_2520[1] = fVar17 * (float)local_24e0._4_4_;
                local_2520[2] = fVar27 * fStack_24d8;
                local_2520[3] = fVar37 * fStack_24d4;
                fStack_2510 = fVar47 * fStack_24d0;
                fStack_250c = fVar57 * fStack_24cc;
                fStack_2508 = fVar67 * fStack_24c8;
                uStack_2504 = uStack_2524;
                local_2500[0] = (float)local_24e0._0_4_ * fVar6;
                local_2500[1] = (float)local_24e0._4_4_ * fVar16;
                local_2500[2] = fStack_24d8 * fVar26;
                local_2500[3] = fStack_24d4 * fVar36;
                fStack_24f0 = fStack_24d0 * fVar46;
                fStack_24ec = fStack_24cc * fVar56;
                fStack_24e8 = fStack_24c8 * fVar66;
                uStack_24e4 = uStack_2524;
                local_2720 = auVar110;
                auVar129 = vrcpps_avx(local_2600);
                fVar116 = auVar129._0_4_;
                fVar120 = auVar129._4_4_;
                auVar88._4_4_ = fVar122 * fVar120;
                auVar88._0_4_ = fVar121 * fVar116;
                fVar121 = auVar129._8_4_;
                auVar88._8_4_ = fVar123 * fVar121;
                fVar122 = auVar129._12_4_;
                auVar88._12_4_ = fVar124 * fVar122;
                fVar123 = auVar129._16_4_;
                auVar88._16_4_ = fVar125 * fVar123;
                fVar124 = auVar129._20_4_;
                auVar88._20_4_ = fVar133 * fVar124;
                fVar125 = auVar129._24_4_;
                auVar88._24_4_ = fVar134 * fVar125;
                auVar88._28_4_ = local_2600._28_4_;
                auVar140._8_4_ = 0x3f800000;
                auVar140._0_8_ = 0x3f8000003f800000;
                auVar140._12_4_ = 0x3f800000;
                auVar140._16_4_ = 0x3f800000;
                auVar140._20_4_ = 0x3f800000;
                auVar140._24_4_ = 0x3f800000;
                auVar140._28_4_ = 0x3f800000;
                auVar129 = vsubps_avx(auVar140,auVar88);
                fVar116 = fVar116 + fVar116 * auVar129._0_4_;
                fVar120 = fVar120 + fVar120 * auVar129._4_4_;
                fVar121 = fVar121 + fVar121 * auVar129._8_4_;
                fVar122 = fVar122 + fVar122 * auVar129._12_4_;
                fVar123 = fVar123 + fVar123 * auVar129._16_4_;
                fVar124 = fVar124 + fVar124 * auVar129._20_4_;
                fVar125 = fVar125 + fVar125 * auVar129._24_4_;
                local_2560._4_4_ = fVar120 * local_2620._4_4_;
                local_2560._0_4_ = fVar116 * local_2620._0_4_;
                local_2560._8_4_ = fVar121 * local_2620._8_4_;
                local_2560._12_4_ = fVar122 * local_2620._12_4_;
                local_2560._16_4_ = fVar123 * local_2620._16_4_;
                local_2560._20_4_ = fVar124 * local_2620._20_4_;
                local_2560._24_4_ = fVar125 * local_2620._24_4_;
                local_2560._28_4_ = auVar129._28_4_;
                auVar141 = ZEXT3264(local_2560);
                local_25a0[0] = local_2660._0_4_ * fVar116;
                local_25a0[1] = local_2660._4_4_ * fVar120;
                local_25a0[2] = local_2660._8_4_ * fVar121;
                local_25a0[3] = local_2660._12_4_ * fVar122;
                fStack_2590 = local_2660._16_4_ * fVar123;
                fStack_258c = local_2660._20_4_ * fVar124;
                fStack_2588 = local_2660._24_4_ * fVar125;
                uStack_2584 = local_2660._28_4_;
                local_2580[0] = local_2640._0_4_ * fVar116;
                local_2580[1] = local_2640._4_4_ * fVar120;
                local_2580[2] = local_2640._8_4_ * fVar121;
                local_2580[3] = local_2640._12_4_ * fVar122;
                fStack_2570 = local_2640._16_4_ * fVar123;
                fStack_256c = local_2640._20_4_ * fVar124;
                fStack_2568 = local_2640._24_4_ * fVar125;
                uStack_2564 = local_2660._28_4_;
                auVar105._8_4_ = 0x7f800000;
                auVar105._0_8_ = 0x7f8000007f800000;
                auVar105._12_4_ = 0x7f800000;
                auVar105._16_4_ = 0x7f800000;
                auVar105._20_4_ = 0x7f800000;
                auVar105._24_4_ = 0x7f800000;
                auVar105._28_4_ = 0x7f800000;
                auVar129 = vblendvps_avx(auVar105,local_2560,auVar110);
                auVar69 = vshufps_avx(auVar129,auVar129,0xb1);
                auVar69 = vminps_avx(auVar129,auVar69);
                auVar70 = vshufpd_avx(auVar69,auVar69,5);
                auVar69 = vminps_avx(auVar69,auVar70);
                auVar70 = vperm2f128_avx(auVar69,auVar69,1);
                auVar69 = vminps_avx(auVar69,auVar70);
                auVar129 = vcmpps_avx(auVar129,auVar69,0);
                auVar69 = auVar110 & auVar129;
                if ((((((((auVar69 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                         (auVar69 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                        (auVar69 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                       SUB321(auVar69 >> 0x7f,0) != '\0') ||
                      (auVar69 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                     SUB321(auVar69 >> 0xbf,0) != '\0') ||
                    (auVar69 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                    auVar69[0x1f] < '\0') {
                  auVar110 = vandps_avx(auVar129,auVar110);
                }
                uVar97 = vextractps_avx(auVar146._0_16_,1);
                uVar91 = vmovmskps_avx(auVar110);
                uVar157 = 0;
                if (uVar91 != 0) {
                  for (; (uVar91 >> uVar157 & 1) == 0; uVar157 = uVar157 + 1) {
                  }
                }
                local_2700._0_8_ = local_2808->scene;
                pSVar98 = local_2808->scene;
LAB_014d452e:
                uVar92 = CONCAT44(0,uVar157);
                local_27a0._0_8_ = uVar92;
                local_2758 = *(uint *)((long)&local_23c0 + uVar92 * 4);
                pGVar4 = (pSVar98->geometries).items[CONCAT44(0,local_2758)].ptr;
                if ((pGVar4->mask & uVar97) == 0) {
                  *(undefined4 *)(local_2720 + uVar92 * 4) = 0;
                }
                else {
                  local_2800._0_8_ = CONCAT44(0,local_2758);
                  local_2740._0_8_ = local_2808->args;
                  local_26e0 = auVar144._0_32_;
                  local_26c0 = auVar141._0_32_;
                  if (local_2808->args->filter == (RTCFilterFunctionN)0x0) {
                    local_27d0.context = local_2808->user;
                    if (pGVar4->intersectionFilterN == (RTCFilterFunctionN)0x0) {
                      fVar116 = local_25a0[uVar92];
                      fVar121 = local_2580[uVar92];
                      (ray->super_RayK<1>).tfar = *(float *)(local_2560 + uVar92 * 4);
                      (ray->Ng).field_0.field_0.x = local_2540[uVar92];
                      (ray->Ng).field_0.field_0.y = local_2520[uVar92];
                      (ray->Ng).field_0.field_0.z = local_2500[uVar92];
                      ray->u = fVar116;
                      ray->v = fVar121;
                      ray->primID = *(uint *)((long)&local_2680 + uVar92 * 4);
                      ray->geomID = local_2758;
                      ray->instID[0] = (local_27d0.context)->instID[0];
                      ray->instPrimID[0] = (local_27d0.context)->instPrimID[0];
                      goto LAB_014d43a0;
                    }
                  }
                  else {
                    local_27d0.context = local_2808->user;
                  }
                  local_2770 = local_2540[uVar92];
                  local_276c = local_2520[uVar92];
                  local_2768 = local_2500[uVar92];
                  local_2764 = local_25a0[uVar92];
                  local_2760 = local_2580[uVar92];
                  local_275c = *(undefined4 *)((long)&local_2680 + uVar92 * 4);
                  local_2754 = (local_27d0.context)->instID[0];
                  local_2750 = (local_27d0.context)->instPrimID[0];
                  (ray->super_RayK<1>).tfar = *(float *)(local_2560 + uVar92 * 4);
                  local_2824 = -1;
                  local_27d0.valid = &local_2824;
                  local_27d0.geometryUserPtr = pGVar4->userPtr;
                  local_2800._0_8_ = ray;
                  local_27d0.ray = (RTCRayN *)ray;
                  local_27d0.hit = (RTCHitN *)&local_2770;
                  local_27d0.N = 1;
                  if ((pGVar4->intersectionFilterN == (RTCFilterFunctionN)0x0) ||
                     ((*pGVar4->intersectionFilterN)(&local_27d0), *local_27d0.valid != 0)) {
                    if ((*(code **)(local_2740._0_8_ + 0x10) != (code *)0x0) &&
                       ((((*(byte *)local_2740._0_8_ & 2) != 0 ||
                         (((pGVar4->field_8).field_0x2 & 0x40) != 0)) &&
                        ((**(code **)(local_2740._0_8_ + 0x10))(&local_27d0), *local_27d0.valid == 0
                        )))) goto LAB_014d47fa;
                    (((Vec3f *)((long)local_27d0.ray + 0x30))->field_0).field_0.x =
                         *(float *)local_27d0.hit;
                    (((Vec3f *)((long)local_27d0.ray + 0x30))->field_0).field_0.y =
                         *(float *)(local_27d0.hit + 4);
                    (((Vec3f *)((long)local_27d0.ray + 0x30))->field_0).field_0.z =
                         *(float *)(local_27d0.hit + 8);
                    *(float *)((long)local_27d0.ray + 0x3c) = *(float *)(local_27d0.hit + 0xc);
                    *(float *)((long)local_27d0.ray + 0x40) = *(float *)(local_27d0.hit + 0x10);
                    *(float *)((long)local_27d0.ray + 0x44) = *(float *)(local_27d0.hit + 0x14);
                    *(float *)((long)local_27d0.ray + 0x48) = *(float *)(local_27d0.hit + 0x18);
                    *(float *)((long)local_27d0.ray + 0x4c) = *(float *)(local_27d0.hit + 0x1c);
                    *(float *)((long)local_27d0.ray + 0x50) = *(float *)(local_27d0.hit + 0x20);
                  }
                  else {
LAB_014d47fa:
                    *(undefined4 *)(local_2800._0_8_ + 0x20) = local_26e0._0_4_;
                  }
                  fVar116 = ((RayK<1> *)local_2800._0_8_)->tfar;
                  auVar106._4_4_ = fVar116;
                  auVar106._0_4_ = fVar116;
                  auVar106._8_4_ = fVar116;
                  auVar106._12_4_ = fVar116;
                  auVar106._16_4_ = fVar116;
                  auVar106._20_4_ = fVar116;
                  auVar106._24_4_ = fVar116;
                  auVar106._28_4_ = fVar116;
                  *(undefined4 *)(local_2720 + local_27a0._0_8_ * 4) = 0;
                  auVar141 = ZEXT3264(local_26c0);
                  auVar110 = vcmpps_avx(local_26c0,auVar106,2);
                  local_2720 = vandps_avx(auVar110,local_2720);
                  uVar97 = ((RayK<1> *)local_2800._0_8_)->mask;
                  auVar144 = ZEXT464((uint)((RayK<1> *)local_2800._0_8_)->tfar);
                  ray = (RayHit *)local_2800._0_8_;
                }
                if ((((((((local_2720 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                         (local_2720 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                        (local_2720 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                       SUB321(local_2720 >> 0x7f,0) == '\0') &&
                      (local_2720 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                     SUB321(local_2720 >> 0xbf,0) == '\0') &&
                    (local_2720 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                    -1 < local_2720[0x1f]) goto LAB_014d43a0;
                auVar115._8_4_ = 0x7f800000;
                auVar115._0_8_ = 0x7f8000007f800000;
                auVar115._12_4_ = 0x7f800000;
                auVar115._16_4_ = 0x7f800000;
                auVar115._20_4_ = 0x7f800000;
                auVar115._24_4_ = 0x7f800000;
                auVar115._28_4_ = 0x7f800000;
                auVar110 = vblendvps_avx(auVar115,auVar141._0_32_,local_2720);
                auVar129 = vshufps_avx(auVar110,auVar110,0xb1);
                auVar129 = vminps_avx(auVar110,auVar129);
                auVar146 = vshufpd_avx(auVar129,auVar129,5);
                auVar129 = vminps_avx(auVar129,auVar146);
                auVar146 = vperm2f128_avx(auVar129,auVar129,1);
                auVar129 = vminps_avx(auVar129,auVar146);
                auVar129 = vcmpps_avx(auVar110,auVar129,0);
                auVar146 = local_2720 & auVar129;
                auVar110 = local_2720;
                if ((((((((auVar146 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                         (auVar146 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                        (auVar146 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                       SUB321(auVar146 >> 0x7f,0) != '\0') ||
                      (auVar146 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                     SUB321(auVar146 >> 0xbf,0) != '\0') ||
                    (auVar146 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                    auVar146[0x1f] < '\0') {
                  auVar110 = vandps_avx(auVar129,local_2720);
                }
                uVar91 = vmovmskps_avx(auVar110);
                uVar157 = 0;
                pSVar98 = (Scene *)local_2700._0_8_;
                if (uVar91 != 0) {
                  for (; (uVar91 >> uVar157 & 1) == 0; uVar157 = uVar157 + 1) {
                  }
                }
                goto LAB_014d452e;
              }
            }
LAB_014d43a0:
            local_2820 = local_2820 + 1;
          } while (local_2820 != local_2818);
        }
        fVar116 = (ray->super_RayK<1>).tfar;
        auVar107 = ZEXT3264(CONCAT428(fVar116,CONCAT424(fVar116,CONCAT420(fVar116,CONCAT416(fVar116,
                                                  CONCAT412(fVar116,CONCAT48(fVar116,CONCAT44(
                                                  fVar116,fVar116))))))));
        auVar141 = ZEXT3264(local_23e0);
        auVar144 = ZEXT3264(local_2400);
        auVar148 = ZEXT3264(local_2420);
        auVar156 = ZEXT3264(local_2440);
        auVar164 = ZEXT3264(local_2460);
        auVar166 = ZEXT3264(local_2480);
        auVar169 = ZEXT3264(local_24a0);
      }
    } while (pauVar89 != (undefined1 (*) [16])&local_23a0);
  }
  return;
}

Assistant:

void BVHNIntersector1<N, types, robust, PrimitiveIntersector1>::intersect(const Accel::Intersectors* __restrict__ This,
                                                                              RayHit& __restrict__ ray,
                                                                              RayQueryContext* __restrict__ context)
    {
      const BVH* __restrict__ bvh = (const BVH*)This->ptr;
      
      /* we may traverse an empty BVH in case all geometry was invalid */
      if (bvh->root == BVH::emptyNode)
        return;
      
      /* perform per ray precalculations required by the primitive intersector */
      Precalculations pre(ray, bvh);

      /* stack state */
      StackItemT<NodeRef> stack[stackSize];    // stack of nodes
      StackItemT<NodeRef>* stackPtr = stack+1; // current stack pointer
      StackItemT<NodeRef>* stackEnd = stack+stackSize;
      stack[0].ptr  = bvh->root;
      stack[0].dist = neg_inf;
      
      if (bvh->root == BVH::emptyNode)
        return;
      
      /* filter out invalid rays */
#if defined(EMBREE_IGNORE_INVALID_RAYS)
      if (!ray.valid()) return;
#endif
      /* verify correct input */
      assert(ray.valid());
      assert(ray.tnear() >= 0.0f);
      assert(!(types & BVH_MB) || (ray.time() >= 0.0f && ray.time() <= 1.0f));

      /* load the ray into SIMD registers */
      TravRay<N,robust> tray(ray.org, ray.dir, max(ray.tnear(), 0.0f), max(ray.tfar, 0.0f));

      /* initialize the node traverser */
      BVHNNodeTraverser1Hit<N, types> nodeTraverser;

      /* pop loop */
      while (true) pop:
      {
        /* pop next node */
        if (unlikely(stackPtr == stack)) break;
        stackPtr--;
        NodeRef cur = NodeRef(stackPtr->ptr);

        /* if popped node is too far, pop next one */
        if (unlikely(*(float*)&stackPtr->dist > ray.tfar))
          continue;

        /* downtraversal loop */
        while (true)
        {
          /* intersect node */
          size_t mask; vfloat<N> tNear;
          STAT3(normal.trav_nodes,1,1,1);
          bool nodeIntersected = BVHNNodeIntersector1<N, types, robust>::intersect(cur, tray, ray.time(), tNear, mask);
          if (unlikely(!nodeIntersected)) { STAT3(normal.trav_nodes,-1,-1,-1); break; }

          /* if no child is hit, pop next node */
          if (unlikely(mask == 0))
            goto pop;

          /* select next child and push other children */
          nodeTraverser.traverseClosestHit(cur, mask, tNear, stackPtr, stackEnd);
        }

        /* this is a leaf node */
        assert(cur != BVH::emptyNode);
        STAT3(normal.trav_leaves,1,1,1);
        size_t num; Primitive* prim = (Primitive*)cur.leaf(num);
        size_t lazy_node = 0;
        PrimitiveIntersector1::intersect(This, pre, ray, context, prim, num, tray, lazy_node);
        tray.tfar = ray.tfar;

        /* push lazy node onto stack */
        if (unlikely(lazy_node)) {
          stackPtr->ptr = lazy_node;
          stackPtr->dist = neg_inf;
          stackPtr++;
        }
      }
    }